

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid.cpp
# Opt level: O0

bool libtorrent::aux::anon_unknown_0::supports_sse42(void)

{
  uint32_t local_18 [2];
  uint32_t cpui [4];
  
  memset(local_18,0,0x10);
  cpuid(local_18,1);
  return (cpui[0] & 0x100000) != 0;
}

Assistant:

bool supports_sse42() noexcept
	{
#if TORRENT_HAS_SSE
		std::uint32_t cpui[4] = {0};
		cpuid(cpui, 1);
		return (cpui[2] & (1 << 20)) != 0;
#else
		return false;
#endif
	}